

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

bool flatbuffers::SaveFile(char *name,char *buf,size_t len,bool binary)

{
  char cVar1;
  undefined7 in_register_00000009;
  _Ios_Openmode _Var2;
  bool bVar3;
  ofstream ofs;
  long local_210;
  filebuf local_208 [24];
  byte abStack_1f0 [216];
  ios_base local_118 [264];
  
  _Var2 = _S_out;
  if ((int)CONCAT71(in_register_00000009,binary) != 0) {
    _Var2 = _S_bin;
  }
  std::ofstream::ofstream(&local_210,name,_Var2);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    bVar3 = false;
  }
  else {
    std::ostream::write((char *)&local_210,(long)buf);
    bVar3 = (abStack_1f0[*(long *)(local_210 + -0x18)] & 1) == 0;
  }
  local_210 = _VTT;
  *(undefined8 *)(local_208 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_208);
  std::ios_base::~ios_base(local_118);
  return bVar3;
}

Assistant:

bool SaveFile(const char *name, const char *buf, size_t len, bool binary) {
  std::ofstream ofs(name, binary ? std::ofstream::binary : std::ofstream::out);
  if (!ofs.is_open()) return false;
  ofs.write(buf, len);
  return !ofs.bad();
}